

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapepiram.cpp
# Opt level: O1

void pzshape::TPZShapePiram::ShapeGenerating
               (TPZVec<double> *pt,TPZVec<int> *nshape,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *dphi)

{
  double dVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  
  lVar10 = 5;
  do {
    if (0 < nshape->fStore[lVar10 + -5]) {
      iVar4 = pztopology::TPZPyramid::ContainedSideLocId((int)lVar10,0);
      iVar5 = pztopology::TPZPyramid::ContainedSideLocId((int)lVar10,1);
      lVar9 = (long)iVar4;
      if (((iVar4 < 0) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar9)) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar7 = (long)iVar5;
      if (((iVar5 < 0) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar7)) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar10) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      phi->fElem[lVar10] = phi->fElem[lVar9] * phi->fElem[lVar7];
      if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
         ((iVar4 < 0 || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar9)))) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((iVar5 < 0) ||
         (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar7 ||
          ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)))) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((iVar4 < 0) ||
         (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar9 ||
          ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)))) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
         ((iVar5 < 0 || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar7)))) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar8 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if ((lVar8 < 1) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar10)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar2 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      dphi->fElem[lVar2 * lVar10] =
           dphi->fElem[(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar9] *
           phi->fElem[lVar7] + phi->fElem[lVar9] * dphi->fElem[lVar8 * lVar7];
      if (((lVar2 < 2) || (iVar4 < 0)) ||
         ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar9)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((iVar5 < 0) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar7)) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((iVar4 < 0) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar9)) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) || (iVar5 < 0)) ||
         ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar7)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar8 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if ((lVar8 < 2) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar10)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar2 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      dphi->fElem[lVar2 * lVar10 + 1] =
           dphi->fElem[(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar9 + 1] *
           phi->fElem[lVar7] + phi->fElem[lVar9] * dphi->fElem[lVar8 * lVar7 + 1];
      if ((lVar2 < 3) ||
         ((iVar4 < 0 || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar9)))) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((iVar5 < 0) ||
         (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar7 ||
          ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)))) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((iVar4 < 0) ||
         (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar9 ||
          ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)))) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 3) ||
         ((iVar5 < 0 || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar7)))) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar8 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if ((lVar8 < 3) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar10)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      dphi->fElem[(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar10 + 2] =
           dphi->fElem[(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar9 + 2] *
           phi->fElem[lVar7] + phi->fElem[lVar9] * dphi->fElem[lVar7 * lVar8 + 2];
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0xd);
  if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 3) ||
     ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 0xe) ||
     ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  phi->fElem[0xd] = *phi->fElem * phi->fElem[2];
  if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 3) ||
     ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar10 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  if ((lVar10 < 1) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0xe)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar9 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  dphi->fElem[lVar9 * 0xd] = *dphi->fElem * phi->fElem[2] + *phi->fElem * dphi->fElem[lVar10 * 2];
  if ((lVar9 < 2) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 3) ||
     ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) ||
     ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar10 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  if ((lVar10 < 2) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0xe)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar9 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  dphi->fElem[lVar9 * 0xd + 1] =
       dphi->fElem[1] * phi->fElem[2] + *phi->fElem * dphi->fElem[lVar10 * 2 + 1];
  if ((lVar9 < 3) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 3) ||
     ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 3) ||
     ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar10 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  if ((lVar10 < 3) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0xe)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  dphi->fElem[(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * 0xd + 2] =
       dphi->fElem[2] * phi->fElem[2] + *phi->fElem * dphi->fElem[lVar10 * 2 + 2];
  lVar10 = 0xe;
  do {
    if (0 < nshape->fStore[lVar10 + -5]) {
      iVar6 = (int)lVar10;
      iVar4 = pztopology::TPZPyramid::ContainedSideLocId(iVar6,0);
      iVar5 = pztopology::TPZPyramid::ContainedSideLocId(iVar6,1);
      iVar6 = pztopology::TPZPyramid::ContainedSideLocId(iVar6,2);
      lVar9 = (long)iVar4;
      if (((iVar4 < 0) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar9)) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar7 = (long)iVar5;
      if (((iVar5 < 0) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar7)) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar8 = (long)iVar6;
      if (((iVar6 < 0) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar8)) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar10) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      phi->fElem[lVar10] = phi->fElem[lVar9] * phi->fElem[lVar7] * phi->fElem[lVar8];
      if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
         ((iVar4 < 0 || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar9)))) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((iVar5 < 0) ||
         (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar7 ||
          ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)))) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((iVar6 < 0) ||
         (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar8 ||
          ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)))) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((iVar4 < 0) ||
         (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar9 ||
          ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)))) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
         ((iVar5 < 0 || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar7)))) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((iVar6 < 0) ||
         (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar8 ||
          ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)))) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((iVar4 < 0) ||
         (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar9 ||
          ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)))) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((iVar5 < 0) ||
         (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar7 ||
          ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)))) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
         ((iVar6 < 0 || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar8)))) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar2 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if ((lVar2 < 1) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar10)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar3 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      dphi->fElem[lVar3 * lVar10] =
           phi->fElem[lVar9] * phi->fElem[lVar7] * dphi->fElem[lVar2 * lVar8] +
           dphi->fElem[(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar9] *
           phi->fElem[lVar7] * phi->fElem[lVar8] +
           phi->fElem[lVar9] *
           dphi->fElem[(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar7] *
           phi->fElem[lVar8];
      if (((lVar3 < 2) || (iVar4 < 0)) ||
         ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar9)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((iVar5 < 0) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar7)) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((iVar6 < 0) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar8)) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((iVar4 < 0) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar9)) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) || (iVar5 < 0)) ||
         ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar7)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((iVar6 < 0) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar8)) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((iVar4 < 0) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar9)) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((iVar5 < 0) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar7)) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) || (iVar6 < 0)) ||
         ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar8)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar2 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if ((lVar2 < 2) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar10)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar3 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      dphi->fElem[lVar3 * lVar10 + 1] =
           phi->fElem[lVar9] * phi->fElem[lVar7] * dphi->fElem[lVar2 * lVar8 + 1] +
           dphi->fElem[(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar9 + 1] *
           phi->fElem[lVar7] * phi->fElem[lVar8] +
           phi->fElem[lVar9] *
           dphi->fElem[(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar7 + 1] *
           phi->fElem[lVar8];
      if ((lVar3 < 3) ||
         ((iVar4 < 0 || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar9)))) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((iVar5 < 0) ||
         (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar7 ||
          ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)))) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((iVar6 < 0) ||
         (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar8 ||
          ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)))) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((iVar4 < 0) ||
         (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar9 ||
          ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)))) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 3) ||
         ((iVar5 < 0 || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar7)))) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((iVar6 < 0) ||
         (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar8 ||
          ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)))) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((iVar4 < 0) ||
         (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar9 ||
          ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)))) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((iVar5 < 0) ||
         (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar7 ||
          ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)))) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 3) ||
         ((iVar6 < 0 || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar8)))) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar2 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if ((lVar2 < 3) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar10)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      dphi->fElem[(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar10 + 2] =
           phi->fElem[lVar9] * phi->fElem[lVar7] * dphi->fElem[lVar8 * lVar2 + 2] +
           dphi->fElem[(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar9 + 2] *
           phi->fElem[lVar7] * phi->fElem[lVar8] +
           phi->fElem[lVar9] *
           dphi->fElem[(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar7 + 2] *
           phi->fElem[lVar8];
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x12);
  if (0 < nshape->fStore[0xd]) {
    if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
       ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 3) ||
       ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 5) ||
       ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 0x13) ||
       ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    phi->fElem[0x12] = *phi->fElem * phi->fElem[2] * phi->fElem[4];
    if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
       ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 3) ||
       ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 5) ||
       ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
       ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
       ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 5) ||
       ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
       ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 3) ||
       ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
       ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 5)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar10 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar10 < 1) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x13)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar9 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    dphi->fElem[lVar9 * 0x12] =
         *phi->fElem * phi->fElem[2] * dphi->fElem[lVar10 * 4] +
         *dphi->fElem * phi->fElem[2] * phi->fElem[4] +
         *phi->fElem * dphi->fElem[(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * 2] *
         phi->fElem[4];
    if ((lVar9 < 2) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 3) ||
       ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 5) ||
       ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
       ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) ||
       ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 5) ||
       ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
       ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 3) ||
       ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) ||
       ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 5)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar10 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar10 < 2) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x13)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar9 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    dphi->fElem[lVar9 * 0x12 + 1] =
         *phi->fElem * phi->fElem[2] * dphi->fElem[lVar10 * 4 + 1] +
         dphi->fElem[1] * phi->fElem[2] * phi->fElem[4] +
         *phi->fElem * dphi->fElem[(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * 2 + 1]
         * phi->fElem[4];
    if ((lVar9 < 3) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 3) ||
       ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 5) ||
       ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
       ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 3) ||
       ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 5) ||
       ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
       ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 3) ||
       ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 3) ||
       ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 5)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar10 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar10 < 3) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x13)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    dphi->fElem[(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * 0x12 + 2] =
         *phi->fElem * phi->fElem[2] * dphi->fElem[lVar10 * 4 + 2] +
         dphi->fElem[2] * phi->fElem[2] * phi->fElem[4] +
         *phi->fElem * dphi->fElem[(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * 2 + 2]
         * phi->fElem[4];
  }
  lVar10 = 5;
  while( true ) {
    if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 0xe) ||
       ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar10) ||
       ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    phi->fElem[lVar10] = phi->fElem[0xd] + phi->fElem[lVar10];
    if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
       ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0xe)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar9 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar9 < 1) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar10)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar7 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    lVar8 = lVar7 * lVar10;
    dphi->fElem[lVar8] = dphi->fElem[lVar9 * 0xd] + dphi->fElem[lVar8];
    if ((lVar7 < 2) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0xe)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar9 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar9 < 2) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar10)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar7 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    lVar8 = lVar7 * lVar10;
    dphi->fElem[lVar8 + 1] = dphi->fElem[lVar9 * 0xd + 1] + dphi->fElem[lVar8 + 1];
    if ((lVar7 < 3) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0xe)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar9 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar9 < 3) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar10)) break;
    lVar7 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar10;
    dphi->fElem[lVar7 + 2] = dphi->fElem[lVar9 * 0xd + 2] + dphi->fElem[lVar7 + 2];
    lVar10 = lVar10 + 1;
    if (lVar10 == 9) {
      lVar10 = 5;
      do {
        if (0 < nshape->fStore[lVar10 + -5]) {
          dVar1 = *(double *)(&DAT_0154d130 + lVar10 * 8);
          if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar10) ||
             ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          phi->fElem[lVar10] = phi->fElem[lVar10] * dVar1;
          if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
             ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar10)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar9 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
          lVar7 = lVar9 * lVar10;
          dphi->fElem[lVar7] = dphi->fElem[lVar7] * dVar1;
          if ((lVar9 < 2) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar10)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar9 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
          lVar7 = lVar9 * lVar10;
          dphi->fElem[lVar7 + 1] = dphi->fElem[lVar7 + 1] * dVar1;
          if ((lVar9 < 3) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar10)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar9 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar10;
          dphi->fElem[lVar9 + 2] = dVar1 * dphi->fElem[lVar9 + 2];
        }
        lVar10 = lVar10 + 1;
        if (lVar10 == 0x13) {
          return;
        }
      } while( true );
    }
  }
  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

void TPZShapePiram::ShapeGenerating(const TPZVec<REAL> &pt, TPZVec<int> &nshape, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi)
    {
        int is;
        // contribute the ribs
        for(is=NCornerNodes; is<NCornerNodes+8; is++)
        {
            if(nshape[is-NCornerNodes] < 1) continue;
            int is1,is2;
            is1 = ContainedSideLocId(is,0);
            is2 = ContainedSideLocId(is,1);
            phi(is,0) = phi(is1,0)*phi(is2,0);
            dphi(0,is) = dphi(0,is1)*phi(is2,0)+phi(is1,0)*dphi(0,is2);
            dphi(1,is) = dphi(1,is1)*phi(is2,0)+phi(is1,0)*dphi(1,is2);
            dphi(2,is) = dphi(2,is1)*phi(is2,0)+phi(is1,0)*dphi(2,is2);
        }
        // contribution of the faces
        // quadrilateral face
        is = 13;
        {
            int is1,is2;
            is1 = ShapeFaceId[0][0];// SideConnectLocId(is,0);
            is2 = ShapeFaceId[0][2];// SideConnectLocId(is,2);
            phi(is,0) = phi(is1,0)*phi(is2,0);
            dphi(0,is) = dphi(0,is1)*phi(is2,0)+phi(is1,0)*dphi(0,is2);
            dphi(1,is) = dphi(1,is1)*phi(is2,0)+phi(is1,0)*dphi(1,is2);
            dphi(2,is) = dphi(2,is1)*phi(is2,0)+phi(is1,0)*dphi(2,is2);
        }
        is++;
        // triangular faces
        for(;is<18; is++)
        {
            if(nshape[is-NCornerNodes] < 1) continue;
            int is1,is2,is3;
            is1 = ContainedSideLocId(is,0);
            is2 = ContainedSideLocId(is,1);
            is3 = ContainedSideLocId(is,2);
            phi(is,0) = phi(is1,0)*phi(is2,0)*phi(is3,0);
            dphi(0,is) = dphi(0,is1)*phi(is2,0)*phi(is3,0)+phi(is1,0)*dphi(0,is2)*phi(is3,0)+phi(is1,0)*phi(is2,0)*dphi(0,is3);
            dphi(1,is) = dphi(1,is1)*phi(is2,0)*phi(is3,0)+phi(is1,0)*dphi(1,is2)*phi(is3,0)+phi(is1,0)*phi(is2,0)*dphi(1,is3);
            dphi(2,is) = dphi(2,is1)*phi(is2,0)*phi(is3,0)+phi(is1,0)*dphi(2,is2)*phi(is3,0)+phi(is1,0)*phi(is2,0)*dphi(2,is3);
            
        }
        if(nshape[NSides-NCornerNodes-1] > 0)
        {
            int is1 = 0;
            int is2 = 2;
            int is3 = 4;
            phi(is,0) = phi(is1,0)*phi(is2,0)*phi(is3,0);
            dphi(0,is) = dphi(0,is1)*phi(is2,0)*phi(is3,0)+phi(is1,0)*dphi(0,is2)*phi(is3,0)+phi(is1,0)*phi(is2,0)*dphi(0,is3);
            dphi(1,is) = dphi(1,is1)*phi(is2,0)*phi(is3,0)+phi(is1,0)*dphi(1,is2)*phi(is3,0)+phi(is1,0)*phi(is2,0)*dphi(1,is3);
            dphi(2,is) = dphi(2,is1)*phi(is2,0)*phi(is3,0)+phi(is1,0)*dphi(2,is2)*phi(is3,0)+phi(is1,0)*phi(is2,0)*dphi(2,is3);
        }
        
        // Make the generating shape functions linear and unitary
        // contribute the ribs
        for(is=NCornerNodes; is<NCornerNodes+4; is++)
        {
            int isface = 13;
            phi(is,0) += phi(isface,0);
            dphi(0,is) += dphi(0,isface);
            dphi(1,is) += dphi(1,isface);
            dphi(2,is) += dphi(2,isface);
        }
        // scaling the shapefunctions
        {
            REAL sidescale[] = {1.,1.,1.,1.,1.,4.,4.,4.,4.,4.,4.,4.,4.,16.,27.,27.,27.,27.,64.};
            for(is=5; is<NSides; is++)
            {
                if(nshape[is-NCornerNodes] < 1) continue;
                phi(is,0) *= sidescale[is];
                dphi(0,is) *= sidescale[is];
                dphi(1,is) *= sidescale[is];
                dphi(2,is) *= sidescale[is];
            }
        }
        
        
    }